

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_utils.hpp
# Opt level: O0

uint64_t time_utils::cumulative_days_in_months_before(uint year,uint month)

{
  bool bVar1;
  uint local_50;
  int local_4c;
  uint m;
  int r;
  int days_in_month [13];
  uint month_local;
  uint year_local;
  
  m = 0;
  r = 0x1f;
  days_in_month[0xc] = month;
  bVar1 = is_leap_year(year);
  days_in_month[0] = 0x1c;
  if (bVar1) {
    days_in_month[0] = 0x1d;
  }
  days_in_month[1] = 0x1f;
  days_in_month[2] = 0x1e;
  days_in_month[3] = 0x1f;
  days_in_month[4] = 0x1e;
  days_in_month[5] = 0x1f;
  days_in_month[6] = 0x1f;
  days_in_month[7] = 0x1e;
  days_in_month[8] = 0x1f;
  days_in_month[9] = 0x1e;
  days_in_month[10] = 0x1f;
  local_4c = 0;
  for (local_50 = 1; local_50 < (uint)days_in_month[0xc]; local_50 = local_50 + 1) {
    local_4c = (&m)[local_50] + local_4c;
  }
  return (long)local_4c;
}

Assistant:

static inline
uint64_t cumulative_days_in_months_before(unsigned year, unsigned month)
{
    const int days_in_month[] = {
        0,
        31,
        is_leap_year(year) ? 29 : 28,
        31,
        30,
        31,
        30,
        31,
        31,
        30,
        31,
        30,
        31,
    };
    int r = 0;
    for (unsigned m = 1; m < month; ++m)
        r += days_in_month[m];
    return r;
}